

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeCalcTabBarLayout
               (ImGuiDockNode *node,ImRect *out_title_rect,ImRect *out_tab_bar_rect,
               ImVec2 *out_window_menu_button_pos,ImVec2 *out_close_button_pos)

{
  float fVar1;
  int iVar2;
  ImGuiContext_conflict1 *pIVar3;
  ImVec2 IVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pIVar3 = GImGui;
  IVar4 = node->Pos;
  fVar7 = IVar4.y;
  fVar8 = (node->Size).x + IVar4.x;
  fVar11 = GImGui->FontSize;
  fVar9 = (GImGui->Style).FramePadding.y;
  fVar9 = fVar9 + fVar9 + fVar7 + fVar11;
  if (out_title_rect != (ImRect *)0x0) {
    out_title_rect->Min = IVar4;
    (out_title_rect->Max).x = fVar8;
    (out_title_rect->Max).y = fVar9;
    fVar11 = pIVar3->FontSize;
  }
  fVar1 = (pIVar3->Style).WindowBorderSize;
  fVar10 = (pIVar3->Style).FramePadding.x;
  fVar6 = IVar4.x + fVar1;
  fVar8 = (fVar8 - fVar1) - fVar10;
  uVar5 = *(uint *)&node->field_0xbc;
  if (((uVar5 >> 0xb & 1) != 0) && (fVar8 = fVar8 - fVar11, out_close_button_pos != (ImVec2 *)0x0))
  {
    out_close_button_pos->x = fVar8 - fVar10;
    out_close_button_pos->y = fVar7;
    uVar5 = (uint)*(ushort *)&node->field_0xbc;
  }
  fVar10 = fVar10 + fVar6;
  if ((uVar5 >> 0xc & 1) != 0) {
    iVar2 = (pIVar3->Style).WindowMenuButtonPosition;
    if (iVar2 == 1) {
      fVar6 = fVar8 - (fVar11 + (pIVar3->Style).FramePadding.x);
      fVar8 = fVar6;
    }
    else if (iVar2 == 0) {
      fVar10 = fVar10 + fVar11 + (pIVar3->Style).ItemInnerSpacing.x;
    }
  }
  if (out_tab_bar_rect != (ImRect *)0x0) {
    (out_tab_bar_rect->Min).x = fVar10;
    (out_tab_bar_rect->Min).y = fVar7;
    (out_tab_bar_rect->Max).x = fVar8;
    (out_tab_bar_rect->Max).y = fVar9;
  }
  if (out_window_menu_button_pos != (ImVec2 *)0x0) {
    IVar4.y = fVar7;
    IVar4.x = fVar6;
    *out_window_menu_button_pos = IVar4;
  }
  return;
}

Assistant:

static void ImGui::DockNodeCalcTabBarLayout(const ImGuiDockNode* node, ImRect* out_title_rect, ImRect* out_tab_bar_rect, ImVec2* out_window_menu_button_pos, ImVec2* out_close_button_pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    ImRect r = ImRect(node->Pos.x, node->Pos.y, node->Pos.x + node->Size.x, node->Pos.y + g.FontSize + g.Style.FramePadding.y * 2.0f);
    if (out_title_rect) { *out_title_rect = r; }

    r.Min.x += style.WindowBorderSize;
    r.Max.x -= style.WindowBorderSize;

    float button_sz = g.FontSize;

    ImVec2 window_menu_button_pos = r.Min;
    r.Min.x += style.FramePadding.x;
    r.Max.x -= style.FramePadding.x;
    if (node->HasCloseButton)
    {
        r.Max.x -= button_sz;
        if (out_close_button_pos) *out_close_button_pos = ImVec2(r.Max.x - style.FramePadding.x, r.Min.y);
    }
    if (node->HasWindowMenuButton && style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        r.Min.x += button_sz + style.ItemInnerSpacing.x;
    }
    else if (node->HasWindowMenuButton && style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        r.Max.x -= button_sz + style.FramePadding.x;
        window_menu_button_pos = ImVec2(r.Max.x, r.Min.y);
    }
    if (out_tab_bar_rect) { *out_tab_bar_rect = r; }
    if (out_window_menu_button_pos) { *out_window_menu_button_pos = window_menu_button_pos; }
}